

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspector.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  LCC_EVENT_TYPE *__s;
  long lVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  FUNCTION_RETURN FVar4;
  LCC_EVENT_TYPE LVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  _Base_ptr p_Var9;
  const_iterator cVar10;
  long *plVar11;
  undefined8 uVar12;
  char *pcVar13;
  pointer __src;
  int i;
  long lVar14;
  _Node *__tmp;
  _List_node_base *p_Var15;
  ExecutionEnvironmentInfo exec_env_info;
  string fname;
  string section_name;
  size_t bufSize;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> adapterInfos;
  TNamesDepend sections;
  CpuInfo cpu;
  DmiInfo dmi_info;
  CallerInformations callerInformation;
  char hw_identifier [20];
  ifstream license_file;
  anon_struct_1044_5_0902c47b osAdapter;
  LicenseLocation licLocation;
  LCC_EVENT_TYPE local_2dc8;
  ExecutionEnvironmentInfo local_2dc4;
  char *local_2db8;
  size_t local_2db0;
  char local_2da8 [16];
  undefined7 *local_2d98;
  size_t local_2d90;
  undefined7 local_2d88;
  undefined1 uStack_2d81;
  undefined7 uStack_2d80;
  undefined1 local_2d79;
  char **local_2d78;
  pointer local_2d70;
  pointer local_2d68;
  size_t local_2d60;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> local_2d58;
  _List_node_base local_2d38;
  undefined8 local_2d28;
  CpuInfo local_2d20;
  DmiInfo local_2cd8;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_2c48;
  CallerInformations local_2bdc;
  char local_2bb8 [32];
  long local_2b98 [4];
  int aiStack_2b78 [123];
  LicenseInfo local_298c;
  LicenseLocation local_1034;
  
  local_2d60 = 0x14;
  local_2d78 = argv;
  if ((_Rb_tree_header *)
      stringByStrategyId_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &stringByStrategyId_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    p_Var9 = stringByStrategyId_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      bVar3 = identify_pc(p_Var9[1]._M_color,local_2bb8,&local_2d60,&local_2dc4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)p_Var9[1]._M_parent,(long)p_Var9[1]._M_left)
      ;
      if (bVar3) {
        local_298c.status[0].severity = CONCAT31(local_298c.status[0].severity._1_3_,0x3a);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_298c,1);
        sVar8 = strlen(local_2bb8);
        pcVar13 = local_2bb8;
      }
      else {
        sVar8 = 4;
        pcVar13 = ": NA";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar13,sVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 !=
             &stringByStrategyId_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Virtualiz. class :",0x12);
  local_298c.status[0].severity = local_2dc4.virtualization;
  cVar10 = std::
           _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&descByVirt_abi_cxx11_._M_h,(key_type *)&local_298c);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      *(char **)((long)cVar10.
                                       super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x10),
                      *(long *)((long)cVar10.
                                      super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                      ._M_cur + 0x18));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Virtualiz. detail:",0x12);
  local_298c.status[0].severity = local_2dc4.virtualization_detail;
  cVar10 = std::
           _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&descByVirtDetail_abi_cxx11_._M_h,(key_type *)&local_298c);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      *(char **)((long)cVar10.
                                       super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x10),
                      *(long *)((long)cVar10.
                                      super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                      ._M_cur + 0x18));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cloud provider   :",0x12);
  local_298c.status[0].severity = local_2dc4.cloud_provider;
  cVar10 = std::
           _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&descByCloudProvider_abi_cxx11_._M_h,(key_type *)&local_298c);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      *(char **)((long)cVar10.
                                       super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                       ._M_cur + 0x10),
                      *(long *)((long)cVar10.
                                      super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                      ._M_cur + 0x18));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_2d58.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d58.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d58.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FVar4 = license::os::getAdapterInfos(&local_2d58);
  if (FVar4 == FUNC_RET_OK) {
    local_2d70 = local_2d58.
                 super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    __src = local_2d58.
            super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (local_2d58.
        super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_2d58.
        super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_2d68 = __src;
        memcpy(&local_298c,__src,0x414);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Network adapter [",0x11);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,local_298c.status[0].severity);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]: ",3);
        __s = &local_298c.status[0].event_type;
        sVar8 = strlen((char *)__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)__s,sVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   ip address [",0xf);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   mac address [",0x10);
        *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) =
             *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        lVar14 = 0;
        do {
          if (lVar14 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          }
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
        lVar14 = std::cout;
        *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) =
             *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
        std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        __src = local_2d68 + 1;
      } while (local_2d68 + 1 != local_2d70);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"problem in getting adapter informations:",0x28);
    plVar11 = (long *)std::ostream::operator<<(&std::cout,FVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
  }
  license::os::CpuInfo::CpuInfo(&local_2d20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cpu Vendor       :",0x12);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2d20.m_vendor._M_dataplus._M_p,
                      local_2d20.m_vendor._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cpu Brand        :",0x12);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2d20.m_brand._M_dataplus._M_p,
                      local_2d20.m_brand._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cpu hypervisor   :",0x12);
  license::os::CpuInfo::is_hypervisor_set(&local_2d20);
  poVar7 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cpu model        :0x",0x14);
  *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) =
       *(uint *)(freeaddrinfo + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  license::os::CpuInfo::model(&local_2d20);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  lVar14 = *(long *)poVar7;
  lVar1 = *(long *)(lVar14 + -0x18);
  *(uint *)(poVar7 + lVar1 + 0x18) = *(uint *)(poVar7 + lVar1 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  license::os::DmiInfo::DmiInfo(&local_2cd8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Bios vendor      :",0x12);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2cd8.m_bios_vendor._M_dataplus._M_p,
                      local_2cd8.m_bios_vendor._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Bios description :",0x12);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2cd8.m_bios_description._M_dataplus._M_p,
                      local_2cd8.m_bios_description._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"System vendor    :",0x12);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2cd8.m_sys_vendor._M_dataplus._M_p,
                      local_2cd8.m_sys_vendor._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cpu Vendor (dmi) :",0x12);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2cd8.m_cpu_manufacturer._M_dataplus._M_p,
                      local_2cd8.m_cpu_manufacturer._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cpu Cores  (dmi) :",0x12);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==================",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_2db8,local_2d78[1],(allocator *)&local_298c);
    std::ifstream::ifstream(local_2b98,(string *)&local_2db8,_S_in);
    if (*(int *)((long)aiStack_2b78 + *(long *)(local_2b98[0] + -0x18)) == 0) {
      memset(&local_1034,0,0x1004);
      if (local_2db0 != 0) {
        memmove(local_1034.licenseData,local_2db8,local_2db0);
      }
      LVar5 = acquire_license((CallerInformations *)0x0,&local_1034,&local_298c);
      if (LVar5 == LICENSE_OK) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"default project [",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEFAULT",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"]: license OK",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"default project [",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"DEFAULT",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"]:",2);
        local_2c48.m_pData = (char *)CONCAT44(local_2c48.m_pData._4_4_,LVar5);
        cVar10 = std::
                 _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&stringByEventType_abi_cxx11_._M_h,(key_type *)&local_2c48);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,
                            *(char **)((long)cVar10.
                                             super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                             ._M_cur + 0x10),
                            *(long *)((long)cVar10.
                                            super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                            ._M_cur + 0x18));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      local_2c48.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_2c48.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
      local_2c48.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_2c48.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2c48.m_pData = (char *)0x0;
      local_2c48.m_uDataLen = 0;
      local_2c48.m_pFileComment = (char *)0x0;
      local_2c48.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2c48.m_strings.
      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_2c48.m_strings;
      local_2c48.m_strings.
      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ._M_impl._M_node._M_size._0_7_ = 0;
      local_2c48._95_4_ = 0;
      local_2c48.m_bSpaces = true;
      local_2c48.m_nOrder = 0;
      local_2c48.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_2c48.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_2c48.m_strings.
      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           local_2c48.m_strings.
           super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                (&local_2c48,local_2db8);
      local_2d28 = 0;
      local_2d38._M_next = &local_2d38;
      local_2d38._M_prev = &local_2d38;
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetAllSections
                (&local_2c48,(TNamesDepend *)&local_2d38);
      p_Var2 = local_2d38._M_next;
      if (local_2d38._M_next != &local_2d38) {
        p_Var15 = local_2d38._M_next;
        do {
          p_Var2 = p_Var15[1]._M_next;
          local_2d98 = &local_2d88;
          if (p_Var2 == (_List_node_base *)0x0) {
            uVar12 = std::__throw_logic_error("basic_string::_M_construct null not valid");
            p_Var2 = local_2d38._M_next;
            while (p_Var2 != &local_2d38) {
              p_Var15 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                           *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              operator_delete(p_Var2);
              p_Var2 = p_Var15;
            }
            CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
                      (&local_2c48);
            std::ifstream::~ifstream(local_2b98);
            if (local_2db8 != local_2da8) {
              operator_delete(local_2db8);
            }
            license::os::DmiInfo::~DmiInfo(&local_2cd8);
            license::os::CpuInfo::~CpuInfo(&local_2d20);
            if (local_2d58.
                super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2d58.
                              super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            _Unwind_Resume(uVar12);
          }
          uStack_2d80 = (undefined7)((ulong)*(undefined8 *)((long)&p_Var2->_M_next + 7) >> 8);
          local_2d88 = SUB87(p_Var2->_M_next,0);
          uStack_2d81 = (undefined1)((ulong)p_Var2->_M_next >> 0x38);
          local_2d90 = 0xf;
          local_2d79 = 0;
          iVar6 = std::__cxx11::string::compare((char *)&local_2d98);
          if (iVar6 != 0) {
            if (local_2d90 != 0) {
              memmove(local_2bdc.feature_name,local_2d98,local_2d90);
            }
            LVar5 = acquire_license(&local_2bdc,&local_1034,&local_298c);
            if (LVar5 == LICENSE_OK) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"project [",9);
              sVar8 = strlen((char *)p_Var2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)p_Var2,sVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"]: license OK",0xd);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
              std::ostream::put('X');
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"project [",9);
              sVar8 = strlen((char *)p_Var2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)p_Var2,sVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"]",1);
              local_2dc8 = LVar5;
              cVar10 = std::
                       _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&stringByEventType_abi_cxx11_._M_h,(key_type *)&local_2dc8);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,
                                  *(char **)((long)cVar10.
                                                  super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                  ._M_cur + 0x10),
                                  *(long *)((long)cVar10.
                                                  super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                  ._M_cur + 0x18));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
            }
          }
          if (local_2d98 != &local_2d88) {
            operator_delete(local_2d98);
          }
          p_Var15 = p_Var15->_M_next;
          p_Var2 = local_2d38._M_next;
        } while (p_Var15 != &local_2d38);
      }
      while (p_Var2 != &local_2d38) {
        p_Var15 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var15;
      }
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
                (&local_2c48);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"license file :",0xe)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_2db8,local_2db0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," not found.",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    std::ifstream::~ifstream(local_2b98);
    if (local_2db8 != local_2da8) {
      operator_delete(local_2db8);
    }
  }
  license::os::DmiInfo::~DmiInfo(&local_2cd8);
  license::os::CpuInfo::~CpuInfo(&local_2d20);
  if (local_2d58.
      super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d58.
                    super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	char hw_identifier[LCC_API_PC_IDENTIFIER_SIZE + 1];
	size_t bufSize = LCC_API_PC_IDENTIFIER_SIZE + 1;
	ExecutionEnvironmentInfo exec_env_info;
	for (const auto& x : stringByStrategyId) {
		if (identify_pc(static_cast<LCC_API_HW_IDENTIFICATION_STRATEGY>(x.first), hw_identifier, &bufSize,
						&exec_env_info)) {
			std::cout << x.second << ':' << hw_identifier << std::endl;
		} else {
			std::cout << x.second << ": NA" << endl;
		}
	}
	cout << "Virtualiz. class :" << descByVirt.find(exec_env_info.virtualization)->second << endl;
	cout << "Virtualiz. detail:" << descByVirtDetail.find(exec_env_info.virtualization_detail)->second << endl;
	cout << "Cloud provider   :" << descByCloudProvider.find(exec_env_info.cloud_provider)->second << endl;

	std::vector<license::os::OsAdapterInfo> adapterInfos;
	FUNCTION_RETURN ret = license::os::getAdapterInfos(adapterInfos);
	if (ret == FUNCTION_RETURN::FUNC_RET_OK) {
		for (auto osAdapter : adapterInfos) {
			cout << "Network adapter [" << osAdapter.id << "]: " << osAdapter.description << endl;
			cout << "   ip address [" << static_cast<unsigned int>(osAdapter.ipv4_address[3]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[2]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[1]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[0]) << "]" << endl;
			cout << "   mac address [" << std::hex;
			for (int i = 0; i < sizeof(osAdapter.mac_address); i++) {
				if (i != 0) {
					cout << ":";
				}
				cout << static_cast<unsigned int>(osAdapter.mac_address[i]);
			}
			cout << "]" << std::dec << endl;
		}
	} else {
		cout << "problem in getting adapter informations:" << ret << endl;
	}

	license::os::CpuInfo cpu;
	cout << "Cpu Vendor       :" << cpu.vendor() << endl;
	cout << "Cpu Brand        :" << cpu.brand() << endl;
	cout << "Cpu hypervisor   :" << cpu.is_hypervisor_set() << endl;
	cout << "Cpu model        :0x" << std::hex << ((long)cpu.model()) << std::dec << endl;
	license::os::DmiInfo dmi_info;
	cout << "Bios vendor      :" << dmi_info.bios_vendor() << endl;
	cout << "Bios description :" << dmi_info.bios_description() << endl;
	cout << "System vendor    :" << dmi_info.sys_vendor() << endl;
	cout << "Cpu Vendor (dmi) :" << dmi_info.cpu_manufacturer() << endl;
	cout << "Cpu Cores  (dmi) :" << dmi_info.cpu_cores() << endl;
	cout << "==================" << endl;
	if (argc == 2) {
		const string fname(argv[1]);
		ifstream license_file(fname);
		if (license_file.good()) {
			verifyLicense(fname);
		} else {
			cerr << "license file :" << fname << " not found." << endl;
		}
	}
	bool find_license_with_env_var = FIND_LICENSE_WITH_ENV_VAR;
	if (find_license_with_env_var) {
		char* env_var_value = getenv(LCC_LICENSE_LOCATION_ENV_VAR);
		if (env_var_value != nullptr && env_var_value[0] != '\0') {
			cout << "environment variable [" << LCC_LICENSE_LOCATION_ENV_VAR << "] value [" << env_var_value << "]"
				 << endl;
			const vector<string> declared_licenses = license::split_string(string(env_var_value), ';');
			for (string fname : declared_licenses) {
				ifstream license_file(fname);
				if (license_file.good()) {
					verifyLicense(fname);
				} else {
					cerr << "license file :" << fname << " not found." << endl;
				}
			}
		} else {
			cout << "environment variable [" << LCC_LICENSE_LOCATION_ENV_VAR << "] configured but not defined." << endl;
		}
	}
}